

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_float4 *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  TypedAttribute<tinyusdz::Animatable<std::array<float,_4UL>_>_> *this;
  _Base_ptr __lhs;
  UsdPrimvarReader_float4 *prop;
  _Base_ptr *this_00;
  double t;
  pointer pSVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  uint32_t uVar5;
  value_type *pvVar6;
  long lVar7;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar9;
  value_type *value;
  ostream *poVar10;
  size_type sVar11;
  mapped_type *this_01;
  _Base_ptr p_Var12;
  UsdPrimvarReader_float4 *args;
  long lVar13;
  ulong uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  Property *args_1;
  Property *this_02;
  Property *args_2;
  UsdPrimvarReader_float4 *pUStackY_610;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff9f8;
  ParseResult ret;
  optional<std::array<float,_4UL>_> local_59c;
  AttrMetas *local_588;
  Property *local_580;
  _Base_ptr local_578;
  optional<std::array<float,_4UL>_> pv;
  undefined1 local_550 [32];
  string attr_type_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e_1;
  undefined1 local_4a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498 [2];
  storage_t<tinyusdz::value::StringData> local_478 [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318 [32];
  optional<tinyusdz::Animatable<std::array<float,_4UL>_>_> av;
  string local_70 [32];
  string local_50;
  UsdPrimvarReader_float4 *pUVar8;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args = preader;
  args_1 = (Property *)warn;
  args_2 = (Property *)err;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::__cxx11::string::string((string *)&av,"info:id",(allocator *)&ss_e_1);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&av);
  ::std::__cxx11::string::_M_dispose();
  local_578 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  this = &preader->fallback;
  local_580 = (Property *)&preader->varname;
  local_588 = &(preader->result)._metas;
  for (p_Var12 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var12 != local_578;
      p_Var12 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12)) {
    __lhs = p_Var12 + 1;
    ::std::__cxx11::string::string((string *)&local_338,(string *)__lhs);
    prop = (UsdPrimvarReader_float4 *)(p_Var12 + 2);
    ::std::__cxx11::string::string
              ((string *)local_550,"inputs:fallback",(allocator *)&stack0xfffffffffffff9ff);
    ret.err._M_dataplus._M_p = (pointer)&ret.err.field_2;
    ret.err._M_string_length = 0;
    ret.err.field_2._M_local_buf[0] = '\0';
    iVar4 = ::std::__cxx11::string::compare((string *)&local_338);
    if (iVar4 == 0) {
      if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
        ret.code = PropertyTypeMismatch;
        ::std::__cxx11::string::string
                  ((string *)&ss_e_1,
                   "Property `{}` must be Attribute, but declared as Relationship.",
                   (allocator *)&attr_type_name);
        fmt::format<std::__cxx11::string>
                  ((string *)&av,(fmt *)&ss_e_1,(string *)local_550,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&av);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      if (p_Var12[6]._M_left != p_Var12[6]._M_parent) {
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &(preader->fallback)._paths,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var12[6]._M_parent)
        ;
        ret.code = Success;
      }
      Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)prop);
      tinyusdz::value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
      _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&av,&attr_type_name);
      if (_Var3) {
        ::std::__cxx11::string::_M_dispose();
LAB_001ce19e:
        iVar4 = *(int *)((long)&p_Var12[0x17]._M_parent + 4);
        if (iVar4 == 1) {
          bVar2 = Attribute::is_blocked((Attribute *)prop);
          if (bVar2) {
            (preader->fallback)._blocked = true;
          }
          this_00 = &p_Var12[4]._M_parent;
          bVar2 = primvar::PrimVar::has_value((PrimVar *)this_00);
          if ((bVar2) || (p_Var12[5]._M_left != p_Var12[5]._M_parent)) {
            av.contained._32_1_ = 0;
            av.contained._33_8_ = 0;
            av.contained._16_8_ = 0;
            av.contained._24_1_ = 0;
            av.contained._25_7_ = 0;
            av.has_value_ = false;
            av._1_7_ = 0;
            av.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            av.contained._8_2_ = 0;
            bVar2 = primvar::PrimVar::is_valid((PrimVar *)this_00);
            if (bVar2) {
              bVar2 = primvar::PrimVar::has_value((PrimVar *)this_00);
              if (bVar2) {
                primvar::PrimVar::get_value<std::array<float,4ul>>(&local_59c,(PrimVar *)this_00);
                pv.has_value_ = local_59c.has_value_;
                if (local_59c.has_value_ != true) goto LAB_001ce400;
                pv.contained._0_8_ = local_59c.contained._0_8_;
                pv.contained._8_8_ = local_59c.contained._8_8_;
                pvVar6 = nonstd::optional_lite::optional<std::array<float,_4UL>_>::value(&pv);
                av._0_8_ = *(undefined8 *)pvVar6->_M_elems;
                av.contained.data.__align =
                     *(anon_struct_8_0_00000001_for___align *)(pvVar6->_M_elems + 2);
                av.contained._8_2_ = 1;
                args = (UsdPrimvarReader_float4 *)p_Var12[5]._M_parent;
                pUVar8 = (UsdPrimvarReader_float4 *)p_Var12[5]._M_left;
                pUStackY_610 = args;
                if (pUVar8 != args) goto LAB_001ce419;
              }
              else {
LAB_001ce400:
                args = (UsdPrimvarReader_float4 *)p_Var12[5]._M_parent;
                pUVar8 = (UsdPrimvarReader_float4 *)p_Var12[5]._M_left;
                if (pUVar8 == args) goto LAB_001ce4f0;
LAB_001ce419:
                lVar13 = 0;
                uVar14 = 0;
                while( true ) {
                  lVar7 = (long)pUVar8 - (long)args;
                  pUStackY_610 = (UsdPrimvarReader_float4 *)0x28;
                  args = (UsdPrimvarReader_float4 *)0x28;
                  if ((ulong)(lVar7 / 0x28) <= uVar14) break;
                  pvVar9 = tinyusdz::value::TimeSamples::get_samples
                                     ((TimeSamples *)&p_Var12[5]._M_parent);
                  pSVar1 = (pvVar9->
                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  if ((&pSVar1->blocked)[lVar13] == true) {
                    TypedTimeSamples<std::array<float,_4UL>_>::add_blocked_sample
                              ((TypedTimeSamples<std::array<float,_4UL>_> *)
                               ((long)&av.contained + 0x10),*(double *)((long)&pSVar1->t + lVar13));
                  }
                  else {
                    tinyusdz::value::Value::get_value<std::array<float,4ul>>
                              (&local_59c,(Value *)((long)&(pSVar1->value).v_.storage + lVar13),
                               false);
                    pv.has_value_ = local_59c.has_value_;
                    if (local_59c.has_value_ != true) {
                      _ss_e_1 = _ss_e_1 & 0xffffff00;
                      local_498[1]._0_8_ = 0;
                      local_498[1]._8_8_ = 0;
                      local_498[0]._0_8_ = 0;
                      local_498[0]._8_8_ = 0;
                      local_4a8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                      local_4a8._8_8_ = 0;
                      local_478[0].data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                      goto LAB_001ce517;
                    }
                    pv.contained._0_8_ = local_59c.contained._0_8_;
                    pv.contained._8_8_ = local_59c.contained._8_8_;
                    t = *(double *)((long)&pSVar1->t + lVar13);
                    pvVar6 = nonstd::optional_lite::optional<std::array<float,_4UL>_>::value(&pv);
                    TypedTimeSamples<std::array<float,_4UL>_>::add_sample
                              ((TypedTimeSamples<std::array<float,_4UL>_> *)
                               ((long)&av.contained + 0x10),t,pvVar6);
                  }
                  uVar14 = uVar14 + 1;
                  args = (UsdPrimvarReader_float4 *)p_Var12[5]._M_parent;
                  pUVar8 = (UsdPrimvarReader_float4 *)p_Var12[5]._M_left;
                  lVar13 = lVar13 + 0x28;
                }
              }
              args = pUStackY_610;
              nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_4UL>_>_>::
              optional<tinyusdz::Animatable<std::array<float,_4UL>_>,_0>
                        ((optional<tinyusdz::Animatable<std::array<float,_4UL>_>_> *)&ss_e_1,
                         (Animatable<std::array<float,_4UL>_> *)&av);
            }
            else {
LAB_001ce4f0:
              _ss_e_1 = _ss_e_1 & 0xffffff00;
              local_498[1]._0_8_ = 0;
              local_498[1]._8_8_ = 0;
              local_498[0]._0_8_ = 0;
              local_498[0]._8_8_ = 0;
              local_4a8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_4a8._8_8_ = 0;
              local_478[0].data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            }
LAB_001ce517:
            ::std::
            _Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
            ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
                             *)((long)&av.contained + 0x10));
            nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_4UL>_>_>::
            optional<tinyusdz::Animatable<std::array<float,_4UL>_>,_0>
                      (&av,(optional<tinyusdz::Animatable<std::array<float,_4UL>_>_> *)&ss_e_1);
            nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_4UL>_>_>::
            ~optional((optional<tinyusdz::Animatable<std::array<float,_4UL>_>_> *)&ss_e_1);
            bVar2 = av.has_value_;
            if (av.has_value_ == true) {
              value = nonstd::optional_lite::
                      optional<tinyusdz::Animatable<std::array<float,_4UL>_>_>::value(&av);
              nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,4ul>>>::
              operator=((optional<tinyusdz::Animatable<std::array<float,4ul>>> *)
                        &(preader->fallback)._attrib,value);
            }
            else {
              ret.code = InternalError;
              ::std::__cxx11::string::assign((char *)&ret.err);
            }
            nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_4UL>_>_>::
            ~optional(&av);
            if (bVar2 == false) goto LAB_001ce5af;
            AttrMetas::operator=(&this->_metas,(AttrMetas *)(p_Var12 + 7));
            goto LAB_001ce59f;
          }
          if (p_Var12[6]._M_left == p_Var12[6]._M_parent) goto LAB_001ce5af;
          AttrMetas::operator=(&this->_metas,(AttrMetas *)(p_Var12 + 7));
          __v = &local_338;
        }
        else {
          if (iVar4 != 0) {
            ::std::__cxx11::string::assign((char *)&ret.err);
            ret.code = InternalError;
            goto LAB_001ce5af;
          }
          (preader->fallback)._value_empty = true;
          AttrMetas::operator=(&this->_metas,(AttrMetas *)(p_Var12 + 7));
LAB_001ce59f:
          __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_550;
        }
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,__v);
        ret.code = Success;
      }
      else {
        tinyusdz::value::TypeTraits<std::array<float,4ul>>::underlying_type_name_abi_cxx11_();
        _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ss_e_1,&attr_type_name);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (_Var3) goto LAB_001ce19e;
        ret.code = TypeMismatch;
        ::std::__cxx11::stringstream::stringstream((stringstream *)&av);
        poVar10 = ::std::operator<<((ostream *)((long)&av.contained + 8),"Property type mismatch. ")
        ;
        poVar10 = ::std::operator<<(poVar10,(string *)local_550);
        poVar10 = ::std::operator<<(poVar10," expects type `");
        tinyusdz::value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
        poVar10 = ::std::operator<<(poVar10,(string *)&ss_e_1);
        poVar10 = ::std::operator<<(poVar10,"` but defined as type `");
        poVar10 = ::std::operator<<(poVar10,(string *)&attr_type_name);
        ::std::operator<<(poVar10,"`");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ss_e_1);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&av);
      }
LAB_001ce5af:
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ret.code = Unmatched;
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    iVar4 = 0;
    if ((ret.code & ~AlreadyProcessed) == Success) {
      bVar2 = false;
      iVar4 = 3;
    }
    else {
      bVar2 = true;
      if (ret.code != Unmatched) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
        poVar10 = ::std::operator<<((ostream *)&av,"[error]");
        poVar10 = ::std::operator<<(poVar10,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   );
        poVar10 = ::std::operator<<(poVar10,":");
        poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
        poVar10 = ::std::operator<<(poVar10,"():");
        poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x10f2);
        ::std::operator<<(poVar10," ");
        ::std::__cxx11::string::string
                  ((string *)&attr_type_name,"Parsing attribute `{}` failed. Error: {}",
                   (allocator *)local_550);
        args = (UsdPrimvarReader_float4 *)&ret.err;
        fmt::format<char[16],std::__cxx11::string>
                  ((string *)&ss_e_1,(fmt *)&attr_type_name,(string *)"inputs:fallback",
                   (char (*) [16])args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
        poVar10 = ::std::operator<<((ostream *)&av,(string *)&ss_e_1);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&attr_type_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err)
          ;
          ::std::__cxx11::string::operator=((string *)err,(string *)&ss_e_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
        bVar2 = false;
        iVar4 = 1;
      }
    }
    ::std::__cxx11::string::_M_dispose();
    this_02 = (Property *)&av;
    if (bVar2) {
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"inputs:varname");
      if (bVar2) {
        ::std::__cxx11::string::string((string *)this_02,"inputs:varname",(allocator *)&ss_e_1);
        sVar11 = ::std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&table,(key_type *)this_02);
        ::std::__cxx11::string::_M_dispose();
        if (sVar11 == 0) {
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)this_02);
          ::std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
          ::std::__cxx11::string::string
                    ((string *)&ss_e_1,"inputs:varname",(allocator *)&attr_type_name);
          args = prop;
          args_1 = (Property *)&ss_e_1;
          args_2 = this_02;
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    (&ret,&table,&local_50,(Property *)prop,(string *)&ss_e_1,
                     (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)this_02);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (ret.code == TypeMismatch) {
            ::std::__cxx11::string::string(local_70,(string *)__lhs);
            ::std::__cxx11::string::string
                      ((string *)&ss_e_1,"inputs:varname",(allocator *)local_550);
            args = prop;
            args_1 = (Property *)&ss_e_1;
            args_2 = local_580;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      ((ParseResult *)&attr_type_name,(_anonymous_namespace_ *)&table,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,(string *)prop,(Property *)&ss_e_1,(string *)local_580,
                       in_stack_fffffffffffff9f8);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            iVar4 = 3;
            if ((int)attr_type_name._M_dataplus._M_p != 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              poVar10 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x110b);
              ::std::operator<<(poVar10," ");
              ::std::__cxx11::string::string
                        ((string *)&pv,"Faied to parse inputs:varname: {}",(allocator *)&local_59c);
              fmt::format<std::__cxx11::string>
                        ((string *)local_550,(fmt *)&pv,(string *)&attr_type_name._M_string_length,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar10 = ::std::operator<<((ostream *)&ss_e_1,(string *)local_550);
              ::std::operator<<(poVar10,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((string *)local_550,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&pv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)err);
                ::std::__cxx11::string::operator=((string *)err,(string *)local_550);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
              iVar4 = 1;
            }
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            iVar4 = 0;
            if (ret.code == Success) {
              bVar2 = ConvertTokenAttributeToStringAttribute
                                ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)this_02,
                                 (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_580);
              iVar4 = 3;
              if (!bVar2) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
                poVar10 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
                poVar10 = ::std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                           );
                poVar10 = ::std::operator<<(poVar10,":");
                poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
                poVar10 = ::std::operator<<(poVar10,"():");
                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x10f9);
                ::std::operator<<(poVar10," ");
                poVar10 = ::std::operator<<((ostream *)&ss_e_1,
                                            "Failed to convert inputs:varname token type to string type."
                                           );
                ::std::operator<<(poVar10,"\n");
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&attr_type_name,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_550,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)err);
                  ::std::__cxx11::string::operator=((string *)err,(string *)&attr_type_name);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
                iVar4 = 1;
              }
            }
          }
          ::std::__cxx11::string::_M_dispose();
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::~TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)this_02);
          if (iVar4 != 0) goto LAB_001ceeb1;
        }
      }
      ::std::__cxx11::string::string(local_318,(string *)__lhs);
      ::std::__cxx11::string::string
                ((string *)&pv,"outputs:result",(allocator *)&stack0xfffffffffffff9ff);
      local_4a8._0_8_ = local_498;
      local_4a8._8_8_ = 0;
      local_498[0]._0_8_ = local_498[0]._0_8_ & 0xffffffffffffff00;
      iVar4 = ::std::__cxx11::string::compare(local_318);
      if (iVar4 == 0) {
        sVar11 = ::std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&table,(key_type *)&pv);
        if (sVar11 == 0) {
          bVar2 = Property::is_attribute_connection((Property *)prop);
          if (bVar2) {
            _ss_e_1 = 5;
            ::std::__cxx11::string::assign(local_4a8);
          }
          else if (*(int *)((long)&p_Var12[0x17]._M_parent + 4) == 0) {
            Attribute::type_name_abi_cxx11_((string *)this_02,(Attribute *)prop);
            bVar2 = tinyusdz::value::IsRoleType((string *)this_02);
            tinyusdz::value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
            _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)this_02);
            ::std::__cxx11::string::_M_dispose();
            if (_Var3) {
              (preader->result)._authored = true;
LAB_001cef9a:
              AttrMetas::operator=(local_588,(AttrMetas *)(p_Var12 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pv);
              _ss_e_1 = 0;
              pUVar8 = args;
              this_02 = args_1;
            }
            else {
              pUVar8 = (UsdPrimvarReader_float4 *)local_550;
              if (bVar2) {
                uVar5 = tinyusdz::value::GetUnderlyingTypeId((string *)this_02);
                if (uVar5 == 0x2b) {
                  (preader->result)._authored = true;
                  ::std::__cxx11::string::_M_assign((string *)&(preader->result)._actual_type_name);
                  goto LAB_001cef9a;
                }
                _ss_e_1 = 3;
                ::std::__cxx11::string::string
                          ((string *)&attr_type_name,
                           "Attribute type mismatch. {} expects type `{}` but defined as type `{}`(and its underlying types)."
                           ,(allocator *)&local_59c);
                tinyusdz::value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          ((string *)&ret,(fmt *)&attr_type_name,(string *)&pv,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pUVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)this_02,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_2);
                ::std::__cxx11::string::operator=((string *)local_4a8,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
              }
              else {
                _ss_e_1 = 3;
                ::std::__cxx11::string::string
                          ((string *)&attr_type_name,
                           "Property type mismatch. {} expects type `{}` but defined as type `{}`.",
                           (allocator *)&local_59c);
                tinyusdz::value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          ((string *)&ret,(fmt *)&attr_type_name,(string *)&pv,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pUVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)this_02,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_2);
                ::std::__cxx11::string::operator=((string *)local_4a8,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::string::_M_dispose();
            args = pUVar8;
            args_1 = this_02;
          }
          else {
            ::std::__cxx11::string::assign(local_4a8);
            _ss_e_1 = 6;
          }
        }
        else {
          _ss_e_1 = 2;
        }
      }
      else {
        _ss_e_1 = 1;
      }
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar4 = 0;
      if ((_ss_e_1 & 0xfffffffd) == 0) {
        iVar4 = 3;
LAB_001ce989:
        bVar2 = false;
      }
      else {
        bVar2 = true;
        if (_ss_e_1 != 1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
          poVar10 = ::std::operator<<((ostream *)&av,"[error]");
          poVar10 = ::std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar10 = ::std::operator<<(poVar10,":");
          poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
          poVar10 = ::std::operator<<(poVar10,"():");
          poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1111);
          ::std::operator<<(poVar10," ");
          ::std::__cxx11::string::string
                    ((string *)&attr_type_name,
                     "Parsing shader output property `{}` failed. Error: {}",(allocator *)local_550)
          ;
          args = (UsdPrimvarReader_float4 *)local_4a8;
          fmt::format<char[15],std::__cxx11::string>
                    ((string *)&ret,(fmt *)&attr_type_name,(string *)"outputs:result",
                     (char (*) [15])args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar10 = ::std::operator<<((ostream *)&av,(string *)&ret);
          ::std::operator<<(poVar10,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&attr_type_name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
          iVar4 = 1;
          goto LAB_001ce989;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar2) goto LAB_001ceeb1;
      sVar11 = ::std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count(&table,(key_type *)__lhs);
      if (sVar11 == 0) {
        this_01 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::operator[](&(preader->super_ShaderNode).super_UsdShadePrim.props,
                               (key_type *)__lhs);
        Property::operator=(this_01,(Property *)prop);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
      }
      sVar11 = ::std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count(&table,(key_type *)__lhs);
      if (sVar11 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
        poVar10 = ::std::operator<<((ostream *)&av,"[warn]");
        poVar10 = ::std::operator<<(poVar10,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   );
        poVar10 = ::std::operator<<(poVar10,":");
        poVar10 = ::std::operator<<(poVar10,"ReconstructShader");
        poVar10 = ::std::operator<<(poVar10,"():");
        poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1113);
        ::std::operator<<(poVar10," ");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &ss_e_1,"Unsupported/unimplemented property: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs)
        ;
        poVar10 = ::std::operator<<((ostream *)&av,(string *)&ss_e_1);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        if (warn != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err)
          ;
          ::std::__cxx11::string::operator=((string *)warn,(string *)&ss_e_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
      }
    }
    else {
LAB_001ceeb1:
      if ((iVar4 != 3) && (iVar4 != 0)) break;
    }
  }
  bVar2 = p_Var12 == local_578;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return bVar2;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_float4>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_float4 *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_float4,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_float4, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float4, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}